

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O0

Vector3D * __thiscall CGL::SceneObjects::EnvironmentLight::sample_dir(EnvironmentLight *this,Ray *r)

{
  long in_RDX;
  Vector2D *in_RDI;
  Vector2D xy;
  Vector2D theta_phi;
  Vector2D *in_stack_000000e0;
  EnvironmentLight *in_stack_000000e8;
  EnvironmentLight *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffd0;
  EnvironmentLight *in_stack_ffffffffffffffd8;
  
  Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffffb8,(Vector3D *)(in_RDX + 0x30));
  dir_to_theta_phi(in_stack_ffffffffffffffd8,(Vector3D *)in_stack_ffffffffffffffd0);
  theta_phi_to_xy(in_stack_ffffffffffffffa8,in_RDI);
  bilerp(in_stack_000000e8,in_stack_000000e0);
  return (Vector3D *)in_RDI;
}

Assistant:

Vector3D EnvironmentLight::sample_dir(const Ray& r) const {
    // TODO: 3-2 Part 3 Task 1
    // Use the helper functions to convert r.d into (x,y)
    // then bilerp the return value

    Vector2D theta_phi = dir_to_theta_phi(r.d);
    Vector2D xy = theta_phi_to_xy(theta_phi);

    return bilerp(xy);
  }